

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkFraigSweep(Abc_Ntk_t *pNtk,int fUseInv,int fExdc,int fVerbose,int fVeryVerbose)

{
  Abc_NtkType_t AVar1;
  void **ppvVar2;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar3;
  bool bVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  Fraig_Node_t *pFVar10;
  Vec_Ptr_t *pVVar11;
  Fraig_Node_t *pFVar12;
  Abc_Obj_t *pAVar13;
  stmm_generator *psVar14;
  char *pcVar15;
  Abc_Obj_t *pAVar16;
  Abc_Obj_t *pAVar17;
  Abc_Obj_t *pAVar18;
  long lVar19;
  stmm_table *table;
  Abc_Obj_t *pAVar20;
  Abc_Obj_t *pAVar21;
  ulong uVar22;
  ulong uVar23;
  stmm_table *table_00;
  float fVar24;
  Abc_Obj_t *pList;
  Fraig_Node_t *gNode;
  Abc_Obj_t **ppSlot;
  Fraig_Params_t Params;
  Abc_Obj_t *local_b8;
  stmm_table *local_b0;
  int local_a4;
  uint local_a0;
  int local_9c;
  stmm_table *local_98;
  Fraig_Man_t *local_90;
  char *local_88;
  Abc_Ntk_t *local_80;
  char **local_78;
  Fraig_Params_t local_70;
  
  AVar1 = pNtk->ntkType;
  local_a4 = fVerbose;
  local_9c = fVeryVerbose;
  if (AVar1 == ABC_NTK_STRASH) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x47,"int Abc_NtkFraigSweep(Abc_Ntk_t *, int, int, int, int)");
  }
  bVar4 = pNtk->ntkFunc == ABC_FUNC_MAP;
  if (AVar1 == ABC_NTK_LOGIC && bVar4) {
    lVar8 = (long)pNtk->vObjs->nSize;
    if (0 < lVar8) {
      ppvVar2 = pNtk->vObjs->pArray;
      lVar19 = 0;
      do {
        pvVar9 = ppvVar2[lVar19];
        if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) {
          *(undefined8 *)((long)pvVar9 + 8) = *(undefined8 *)((long)pvVar9 + 0x38);
        }
        lVar19 = lVar19 + 1;
      } while (lVar8 != lVar19);
    }
  }
  local_80 = Abc_NtkStrash(pNtk,0,1,0);
  if (AVar1 == ABC_NTK_LOGIC && bVar4) {
    Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
    pvVar9 = Abc_FrameReadLibGen();
    pNtk->pManFunc = pvVar9;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    pVVar11 = pNtk->vObjs;
    if (0 < pVVar11->nSize) {
      lVar8 = 0;
      do {
        pvVar9 = pVVar11->pArray[lVar8];
        if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) {
          *(undefined8 *)((long)pvVar9 + 0x38) = *(undefined8 *)((long)pvVar9 + 8);
          *(undefined8 *)((long)pvVar9 + 8) = 0;
        }
        lVar8 = lVar8 + 1;
        pVVar11 = pNtk->vObjs;
      } while (lVar8 < pVVar11->nSize);
    }
  }
  Fraig_ParamsSetDefault(&local_70);
  local_70.fInternal = 1;
  local_90 = (Fraig_Man_t *)Abc_NtkToFraig(local_80,&local_70,0,0);
  if (fExdc != 0) {
    if (pNtk->pExdc == (Abc_Ntk_t *)0x0) {
      puts("Warning: Networks has no EXDC.");
    }
    else {
      pFVar10 = Abc_NtkToFraigExdc(local_90,pNtk,pNtk->pExdc);
      pVVar11 = pNtk->vObjs;
      if (0 < pVVar11->nSize) {
        lVar8 = 0;
        do {
          pvVar9 = pVVar11->pArray[lVar8];
          if ((((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) &&
              (*(int *)((long)pvVar9 + 0x1c) != 0)) &&
             (uVar23 = *(ulong *)((long)pvVar9 + 0x40), uVar23 != 0)) {
            uVar22 = (ulong)((uint)uVar23 & 1);
            pFVar12 = Fraig_NodeAnd(local_90,(Fraig_Node_t *)
                                             (*(ulong *)((uVar23 & 0xfffffffffffffffe) + 0x40) ^
                                             uVar22),(Fraig_Node_t *)((ulong)pFVar10 ^ 1));
            *(ulong *)((uVar23 & 0xfffffffffffffffe) + 0x40) = (ulong)pFVar12 ^ uVar22;
          }
          lVar8 = lVar8 + 1;
          pVVar11 = pNtk->vObjs;
        } while (lVar8 < pVVar11->nSize);
      }
    }
  }
  Abc_NtkLevel(pNtk);
  local_b0 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  pVVar11 = pNtk->vObjs;
  if (0 < pVVar11->nSize) {
    lVar8 = 0;
    do {
      pAVar18 = (Abc_Obj_t *)pVVar11->pArray[lVar8];
      if (((pAVar18 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar18->field_0x14 & 0xf) == 7)) &&
         (((pAVar18->vFanins).nSize != 0 &&
          ((aVar3 = pAVar18->field_6, aVar3.pTemp != (void *)0x0 &&
           (pAVar13 = Abc_NodeFindCoFanout(pAVar18), pAVar13 == (Abc_Obj_t *)0x0)))))) {
        uVar23 = *(ulong *)(((ulong)aVar3.pTemp & 0xfffffffffffffffe) + 0x40);
        local_88 = (char *)(aVar3.iTemp & 1 ^ uVar23);
        iVar7 = stmm_find_or_add(local_b0,(char *)(uVar23 & 0xfffffffffffffffe),&local_78);
        if (iVar7 == 0) {
          *local_78 = (char *)0x0;
        }
        pAVar18->pNext = (Abc_Obj_t *)*local_78;
        *local_78 = (char *)pAVar18;
        *(uint *)&pAVar18->field_0x14 =
             *(uint *)&pAVar18->field_0x14 & 0xffffff7f | ((uint)local_88 & 1) << 7;
      }
      lVar8 = lVar8 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar8 < pVVar11->nSize);
  }
  local_98 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  table = local_b0;
  psVar14 = stmm_init_gen(local_b0);
  iVar7 = stmm_gen(psVar14,&local_88,(char **)&local_b8);
  if (iVar7 == 0) {
    uVar23 = 0;
  }
  else {
    uVar23 = 0;
    local_a0 = 0;
    do {
      if ((local_b8 != (Abc_Obj_t *)0x0) && (local_b8->pNext != (Abc_Obj_t *)0x0)) {
        stmm_insert(local_98,(char *)local_b8,(char *)0x0);
        for (pAVar18 = local_b8; pAVar18 != (Abc_Obj_t *)0x0; pAVar18 = pAVar18->pNext) {
          uVar23 = (ulong)((int)uVar23 + 1);
        }
        if (local_9c != 0) {
          printf("Class %2d : {",(ulong)local_a0);
          for (pAVar18 = local_b8; pAVar18 != (Abc_Obj_t *)0x0; pAVar18 = pAVar18->pNext) {
            (pAVar18->field_6).pTemp = (void *)0x0;
            pcVar15 = Abc_ObjName(pAVar18);
            printf(" %s",pcVar15);
            printf("(%c)",(ulong)((uint)((byte)pAVar18->field_0x14 >> 7) * 2 + 0x2b));
            printf("(%d)",(ulong)(*(uint *)&pAVar18->field_0x14 >> 0xc));
          }
          puts(" }");
          local_a0 = local_a0 + 1;
          table = local_b0;
        }
      }
      iVar7 = stmm_gen(psVar14,&local_88,(char **)&local_b8);
    } while (iVar7 != 0);
  }
  stmm_free_gen(psVar14);
  table_00 = local_98;
  if (local_9c != 0 || local_a4 != 0) {
    printf("Sweeping stats for network \"%s\":\n",pNtk->pName);
    printf("Internal nodes = %d. Different functions (up to compl) = %d.\n",
           (ulong)(uint)pNtk->nObjCounts[7],(ulong)(uint)table->num_entries);
    printf("Non-trivial classes = %d. Nodes in non-trivial classes = %d.\n",
           (ulong)(uint)table_00->num_entries,uVar23);
  }
  stmm_free_table(table);
  if (table_00->num_entries != 0) {
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      Abc_NtkDelayTrace(pNtk,(Abc_Obj_t *)0x0,(Abc_Obj_t *)0x0,0);
      psVar14 = stmm_init_gen(table_00);
      while (iVar7 = stmm_gen(psVar14,(char **)&local_b8,(char **)0x0), iVar7 != 0) {
        if (local_b8 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x13b,
                        "void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        if (local_b8->pNext == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain->pNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x13c,
                        "void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        pAVar18 = (Abc_Obj_t *)0x0;
        pAVar13 = local_b8;
        pAVar16 = local_b8->pNext;
        pAVar17 = (Abc_Obj_t *)0x0;
        while( true ) {
          pAVar20 = pAVar17;
          pAVar5 = pAVar13;
          pAVar21 = pAVar18;
          if (-1 < (char)pAVar13->field_0x14) {
            pAVar20 = pAVar13;
            pAVar5 = pAVar18;
            pAVar21 = pAVar17;
          }
          pAVar18 = pAVar5;
          pAVar13->pNext = pAVar21;
          pAVar13 = pAVar18;
          pAVar17 = pAVar18;
          if (pAVar16 == (Abc_Obj_t *)0x0) break;
          pAVar13 = pAVar16;
          pAVar16 = pAVar16->pNext;
          pAVar17 = pAVar20;
        }
        for (; pAVar13 != (Abc_Obj_t *)0x0; pAVar13 = pAVar13->pNext) {
          fVar24 = Abc_NodeReadArrivalWorst(pAVar17);
          local_b0 = (stmm_table *)CONCAT44(local_b0._4_4_,fVar24);
          fVar24 = Abc_NodeReadArrivalWorst(pAVar13);
          pAVar16 = pAVar13;
          if ((local_b0._0_4_ <= fVar24) &&
             (((local_b0._0_4_ != fVar24 || (NAN(local_b0._0_4_) || NAN(fVar24))) ||
              (*(uint *)&pAVar17->field_0x14 >> 0xc <= *(uint *)&pAVar13->field_0x14 >> 0xc)))) {
            pAVar16 = pAVar17;
          }
          pAVar17 = pAVar16;
        }
        for (; pAVar13 = pAVar20, pAVar16 = pAVar20, pAVar18 != (Abc_Obj_t *)0x0;
            pAVar18 = pAVar18->pNext) {
          if (pAVar18 != pAVar17) {
            Abc_ObjTransferFanout(pAVar18,pAVar17);
          }
        }
        for (; pAVar13 != (Abc_Obj_t *)0x0; pAVar13 = pAVar13->pNext) {
          fVar24 = Abc_NodeReadArrivalWorst(pAVar16);
          local_b0 = (stmm_table *)CONCAT44(local_b0._4_4_,fVar24);
          fVar24 = Abc_NodeReadArrivalWorst(pAVar13);
          pAVar18 = pAVar13;
          if ((local_b0._0_4_ <= fVar24) &&
             (((local_b0._0_4_ != fVar24 || (NAN(local_b0._0_4_) || NAN(fVar24))) ||
              (*(uint *)&pAVar16->field_0x14 >> 0xc <= *(uint *)&pAVar13->field_0x14 >> 0xc)))) {
            pAVar18 = pAVar16;
          }
          pAVar16 = pAVar18;
        }
        for (; pAVar20 != (Abc_Obj_t *)0x0; pAVar20 = pAVar20->pNext) {
          if (pAVar20 != pAVar16) {
            Abc_ObjTransferFanout(pAVar20,pAVar16);
          }
        }
      }
    }
    else {
      psVar14 = stmm_init_gen(table_00);
      iVar7 = stmm_gen(psVar14,(char **)&local_b8,(char **)0x0);
      while (iVar7 != 0) {
        if (local_b8 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x18d,"void Abc_NtkFraigMergeClass(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        pAVar18 = local_b8->pNext;
        pAVar13 = pAVar18;
        pAVar16 = local_b8;
        if (pAVar18 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain->pNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x18e,"void Abc_NtkFraigMergeClass(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        do {
          pAVar17 = pAVar13;
          if (*(uint *)&pAVar16->field_0x14 >> 0xc <= *(uint *)&pAVar13->field_0x14 >> 0xc) {
            pAVar17 = pAVar16;
          }
          pAVar16 = pAVar17;
          pAVar13 = pAVar13->pNext;
        } while (pAVar13 != (Abc_Obj_t *)0x0);
        pAVar13 = (Abc_Obj_t *)0x0;
        pAVar17 = local_b8;
        pAVar20 = (Abc_Obj_t *)0x0;
        while( true ) {
          pAVar21 = pAVar20;
          if (pAVar17 != pAVar16) {
            pAVar6 = pAVar17;
            pAVar5 = pAVar13;
            if (-1 < (char)(pAVar17->field_0x14 ^ pAVar16->field_0x14)) {
              pAVar21 = pAVar17;
              pAVar6 = pAVar13;
              pAVar5 = pAVar20;
            }
            pAVar13 = pAVar6;
            pAVar17->pNext = pAVar5;
          }
          if (pAVar18 == (Abc_Obj_t *)0x0) break;
          pAVar17 = pAVar18;
          pAVar18 = pAVar18->pNext;
          pAVar20 = pAVar21;
        }
        for (; pAVar21 != (Abc_Obj_t *)0x0; pAVar21 = pAVar21->pNext) {
          Abc_ObjTransferFanout(pAVar21,pAVar16);
        }
        if (pAVar13 != (Abc_Obj_t *)0x0) {
          pAVar18 = Abc_NtkCreateNodeInv(pNtk,pAVar16);
          do {
            Abc_ObjTransferFanout(pAVar13,pAVar18);
            pAVar13 = pAVar13->pNext;
          } while (pAVar13 != (Abc_Obj_t *)0x0);
        }
        iVar7 = stmm_gen(psVar14,(char **)&local_b8,(char **)0x0);
      }
    }
    stmm_free_gen(psVar14);
    table_00 = local_98;
  }
  stmm_free_table(table_00);
  Fraig_ManFree(local_90);
  Abc_NtkDelete(local_80);
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    Abc_NtkCleanup(pNtk,local_a4);
  }
  else {
    Abc_NtkSweep(pNtk,local_a4);
  }
  iVar7 = Abc_NtkCheck(pNtk);
  if (iVar7 == 0) {
    puts("Abc_NtkFraigSweep: The network check has failed.");
  }
  return (uint)(iVar7 != 0);
}

Assistant:

int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig;
    Fraig_Man_t * pMan;
    stmm_table * tEquiv;
    Abc_Obj_t * pObj;
    int i, fUseTrick;

    assert( !Abc_NtkIsStrash(pNtk) );

    // save gate assignments
    fUseTrick = 0;
    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        fUseTrick = 1;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pNext = (Abc_Obj_t *)pObj->pData;
    }
    // derive the AIG
    pNtkAig = Abc_NtkStrash( pNtk, 0, 1, 0 );
    // reconstruct gate assignments
    if ( fUseTrick )
    {
//        extern void * Abc_FrameReadLibGen(); 
        Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
        pNtk->pManFunc = Abc_FrameReadLibGen();
        pNtk->ntkFunc = ABC_FUNC_MAP;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pData = pObj->pNext, pObj->pNext = NULL;
    }

    // perform fraiging of the AIG
    Fraig_ParamsSetDefault( &Params );
    Params.fInternal = 1;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtkAig, &Params, 0, 0 );   
    // cannot use EXDC with FRAIG because it can create classes of equivalent FRAIG nodes
    // with representative nodes that do not correspond to the nodes with the current network

    // update FRAIG using EXDC
    if ( fExdc )
    {
        if ( pNtk->pExdc == NULL )
            printf( "Warning: Networks has no EXDC.\n" );
        else
            Abc_NtkFraigSweepUsingExdc( pMan, pNtk );
    }
    // assign levels to the nodes of the network
    Abc_NtkLevel( pNtk );

    // collect the classes of equivalent nets
    tEquiv = Abc_NtkFraigEquiv( pNtk, fUseInv, fVerbose, fVeryVerbose );

    // transform the network into the equivalent one
    Abc_NtkFraigTransform( pNtk, tEquiv, fUseInv, fVerbose );
    stmm_free_table( tEquiv );

    // free the manager
    Fraig_ManFree( pMan );
    Abc_NtkDelete( pNtkAig );

    // cleanup the dangling nodes
    if ( Abc_NtkHasMapping(pNtk) )
        Abc_NtkCleanup( pNtk, fVerbose );
    else
        Abc_NtkSweep( pNtk, fVerbose );

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkFraigSweep: The network check has failed.\n" );
        return 0;
    }
    return 1;
}